

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O1

int fits_quantize_double
              (long row,double *fdata,long nxpix,long nypix,int nullcheck,double in_null_value,
              float qlevel,int dither_method,int *idata,double *bscale,double *bzero,int *iminval,
              int *imaxval)

{
  double dVar1;
  float *pfVar2;
  long lVar3;
  double *pdVar4;
  double *arr;
  double *__base;
  double *__base_00;
  double *pdVar5;
  uint uVar6;
  size_t sVar7;
  long lVar8;
  size_t __nmemb;
  size_t sVar9;
  size_t sVar10;
  int iVar11;
  double *pdVar12;
  long lVar13;
  size_t __nmemb_00;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  size_t sVar20;
  long lVar21;
  size_t __nmemb_01;
  long lVar22;
  ulong uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  double dVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double *local_f0;
  double *local_d0;
  double local_c8;
  double local_a8;
  double local_98;
  size_t local_80;
  double local_78;
  double local_68;
  
  lVar21 = nypix * nxpix;
  if (lVar21 < 2) {
    iVar14 = 0;
    dVar28 = 0.0;
    dVar34 = 1.0;
LAB_001f8aa6:
    *bscale = dVar34;
    *bzero = dVar28;
  }
  else {
    if (0.0 <= qlevel) {
      lVar13 = 1;
      __nmemb = nypix;
      if (nxpix < 9) {
        __nmemb = 1;
        lVar13 = nypix;
      }
      __nmemb_01 = lVar13 * nxpix;
      if ((long)__nmemb_01 < 9) {
        local_c8 = 0.0;
        if ((long)__nmemb_01 < 1) {
          local_68 = -1.79769313486232e+308;
          local_78 = 1.79769313486232e+308;
          lVar22 = 0;
        }
        else {
          local_78 = 1.79769313486232e+308;
          local_68 = -1.79769313486232e+308;
          lVar13 = 0;
          lVar22 = 0;
          do {
            if (nullcheck == 0) {
LAB_001f7989:
              dVar34 = fdata[lVar13];
              uVar24 = SUB84(dVar34,0);
              uVar26 = (undefined4)((ulong)dVar34 >> 0x20);
              dVar28 = dVar34;
              if (local_78 <= dVar34) {
                dVar28 = local_78;
              }
              local_78 = dVar28;
              if (dVar34 <= local_68) {
                uVar24 = SUB84(local_68,0);
                uVar26 = (undefined4)((ulong)local_68 >> 0x20);
              }
              lVar22 = lVar22 + 1;
              local_68 = (double)CONCAT44(uVar26,uVar24);
            }
            else if ((fdata[lVar13] != in_null_value) || (NAN(fdata[lVar13]) || NAN(in_null_value)))
            goto LAB_001f7989;
            lVar13 = lVar13 + 1;
          } while (__nmemb_01 - lVar13 != 0);
        }
        local_a8 = 0.0;
        local_98 = 0.0;
      }
      else {
        pdVar4 = (double *)calloc(__nmemb_01,8);
        if (pdVar4 == (double *)0x0) {
          local_c8 = 0.0;
          lVar22 = 0;
          local_a8 = 0.0;
          local_98 = 0.0;
          local_78 = 0.0;
          local_68 = 0.0;
        }
        else {
          arr = (double *)calloc(__nmemb_01,8);
          if (arr == (double *)0x0) {
            local_c8 = 0.0;
            lVar22 = 0;
            local_a8 = 0.0;
            local_98 = 0.0;
            local_78 = 0.0;
            local_68 = 0.0;
          }
          else {
            local_d0 = (double *)calloc(__nmemb_01,8);
            if (local_d0 == (double *)0x0) {
              local_c8 = 0.0;
              lVar22 = 0;
              local_a8 = 0.0;
              local_98 = 0.0;
              local_78 = 0.0;
              local_68 = 0.0;
            }
            else {
              __base = (double *)calloc(__nmemb,8);
              local_f0 = arr;
              if (__base == (double *)0x0) {
                local_c8 = 0.0;
                lVar22 = 0;
                local_a8 = 0.0;
                local_98 = 0.0;
                local_78 = 0.0;
                local_68 = 0.0;
              }
              else {
                __base_00 = (double *)calloc(__nmemb,8);
                if (__base_00 == (double *)0x0) {
                  local_c8 = 0.0;
                  lVar22 = 0;
                  local_a8 = 0.0;
                  local_98 = 0.0;
                  local_78 = 0.0;
                  local_68 = 0.0;
                  local_f0 = local_d0;
                  local_d0 = __base;
                }
                else {
                  pdVar5 = (double *)calloc(__nmemb,8);
                  if (pdVar5 == (double *)0x0) {
                    local_c8 = 0.0;
                    lVar22 = 0;
                    local_a8 = 0.0;
                    local_98 = 0.0;
                    local_78 = 0.0;
                    local_68 = 0.0;
                    pdVar5 = __base_00;
                    local_f0 = __base;
                  }
                  else {
                    if ((long)__nmemb < 1) {
                      local_68 = -1.79769313486232e+308;
                      local_78 = 1.79769313486232e+308;
                      lVar22 = 0;
                      local_80 = 0;
                      __nmemb_00 = 0;
                    }
                    else {
                      local_78 = 1.79769313486232e+308;
                      local_68 = -1.79769313486232e+308;
                      sVar20 = 0;
                      __nmemb_00 = 0;
                      local_80 = 0;
                      lVar22 = 0;
                      pdVar12 = fdata;
                      do {
                        sVar9 = 0;
                        sVar10 = sVar9;
                        if (nullcheck != 0) {
                          do {
                            sVar10 = sVar9;
                            if ((pdVar12[sVar9] != in_null_value) ||
                               (NAN(pdVar12[sVar9]) || NAN(in_null_value))) break;
                            sVar9 = sVar9 + 1;
                            sVar10 = __nmemb_01;
                          } while (__nmemb_01 - sVar9 != 0);
                        }
                        if (sVar10 != __nmemb_01) {
                          sVar9 = sVar10 + 1;
                          sVar7 = sVar9;
                          if ((nullcheck != 0) && ((long)sVar9 < (long)__nmemb_01)) {
                            while (sVar7 = sVar9, pdVar12[sVar9] == in_null_value) {
                              if ((NAN(pdVar12[sVar9]) || NAN(in_null_value)) ||
                                 (sVar9 = sVar9 + 1, sVar7 = __nmemb_01, __nmemb_01 - sVar9 == 0))
                              break;
                            }
                          }
                          lVar8 = sVar20 * __nmemb_01;
                          dVar34 = fdata[lVar8 + sVar10];
                          uVar24 = SUB84(dVar34,0);
                          uVar26 = (undefined4)((ulong)dVar34 >> 0x20);
                          dVar28 = dVar34;
                          if (local_78 <= dVar34) {
                            dVar28 = local_78;
                          }
                          if (dVar34 <= local_68) {
                            dVar34 = local_68;
                          }
                          if (sVar7 == __nmemb_01) {
                            lVar22 = lVar22 + 1;
                            local_68 = dVar34;
                            local_78 = dVar28;
                          }
                          else {
                            sVar10 = sVar7 + 1;
                            sVar9 = sVar10;
                            if ((nullcheck != 0) && ((long)sVar10 < (long)__nmemb_01)) {
                              while (sVar9 = sVar10, pdVar12[sVar10] == in_null_value) {
                                if ((NAN(pdVar12[sVar10]) || NAN(in_null_value)) ||
                                   (sVar10 = sVar10 + 1, sVar9 = __nmemb_01,
                                   __nmemb_01 - sVar10 == 0)) break;
                              }
                            }
                            dVar32 = fdata[lVar8 + sVar7];
                            uVar29 = SUB84(dVar32,0);
                            uVar30 = (undefined4)((ulong)dVar32 >> 0x20);
                            uVar25 = uVar29;
                            uVar27 = uVar30;
                            if (dVar28 <= dVar32) {
                              uVar25 = SUB84(dVar28,0);
                              uVar27 = (undefined4)((ulong)dVar28 >> 0x20);
                            }
                            if (dVar32 <= dVar34) {
                              uVar29 = SUB84(dVar34,0);
                              uVar30 = (undefined4)((ulong)dVar34 >> 0x20);
                            }
                            if (sVar9 == __nmemb_01) {
                              lVar22 = lVar22 + 2;
                              local_68 = (double)CONCAT44(uVar30,uVar29);
                              local_78 = (double)CONCAT44(uVar27,uVar25);
                            }
                            else {
                              sVar10 = sVar9 + 1;
                              sVar7 = sVar10;
                              if ((nullcheck != 0) && ((long)sVar10 < (long)__nmemb_01)) {
                                while (sVar7 = sVar10, pdVar12[sVar10] == in_null_value) {
                                  if ((NAN(pdVar12[sVar10]) || NAN(in_null_value)) ||
                                     (sVar10 = sVar10 + 1, sVar7 = __nmemb_01,
                                     __nmemb_01 - sVar10 == 0)) break;
                                }
                              }
                              dVar34 = fdata[lVar8 + sVar9];
                              dVar28 = dVar34;
                              if ((double)CONCAT44(uVar27,uVar25) <= dVar34) {
                                dVar28 = (double)CONCAT44(uVar27,uVar25);
                              }
                              dVar33 = dVar34;
                              if (dVar34 <= (double)CONCAT44(uVar30,uVar29)) {
                                dVar33 = (double)CONCAT44(uVar30,uVar29);
                              }
                              if (sVar7 == __nmemb_01) {
                                lVar22 = lVar22 + 3;
                                local_68 = dVar33;
                                local_78 = dVar28;
                              }
                              else {
                                sVar10 = sVar7 + 1;
                                sVar9 = sVar10;
                                if ((nullcheck != 0) && ((long)sVar10 < (long)__nmemb_01)) {
                                  while (sVar9 = sVar10, pdVar12[sVar10] == in_null_value) {
                                    if ((NAN(pdVar12[sVar10]) || NAN(in_null_value)) ||
                                       (sVar10 = sVar10 + 1, sVar9 = __nmemb_01,
                                       __nmemb_01 - sVar10 == 0)) break;
                                  }
                                }
                                dVar1 = fdata[lVar8 + sVar7];
                                local_78 = dVar1;
                                if (dVar28 <= dVar1) {
                                  local_78 = dVar28;
                                }
                                local_68 = dVar1;
                                if (dVar1 <= dVar33) {
                                  local_68 = dVar33;
                                }
                                if (sVar9 == __nmemb_01) {
                                  lVar22 = lVar22 + 4;
                                }
                                else {
                                  sVar10 = sVar9 + 1;
                                  sVar7 = sVar10;
                                  if ((nullcheck != 0) && ((long)sVar10 < (long)__nmemb_01)) {
                                    while (sVar7 = sVar10, pdVar12[sVar10] == in_null_value) {
                                      if ((NAN(pdVar12[sVar10]) || NAN(in_null_value)) ||
                                         (sVar10 = sVar10 + 1, sVar7 = __nmemb_01,
                                         __nmemb_01 - sVar10 == 0)) break;
                                    }
                                  }
                                  dVar28 = fdata[lVar8 + sVar9];
                                  dVar33 = dVar28;
                                  if (local_78 <= dVar28) {
                                    dVar33 = local_78;
                                  }
                                  dVar36 = dVar28;
                                  if (dVar28 <= local_68) {
                                    dVar36 = local_68;
                                  }
                                  if (sVar7 == __nmemb_01) {
                                    lVar22 = lVar22 + 5;
                                    local_68 = dVar36;
                                    local_78 = dVar33;
                                  }
                                  else {
                                    sVar10 = sVar7 + 1;
                                    sVar9 = sVar10;
                                    if ((nullcheck != 0) && ((long)sVar10 < (long)__nmemb_01)) {
                                      while (sVar9 = sVar10, pdVar12[sVar10] == in_null_value) {
                                        if ((NAN(pdVar12[sVar10]) || NAN(in_null_value)) ||
                                           (sVar10 = sVar10 + 1, sVar9 = __nmemb_01,
                                           __nmemb_01 - sVar10 == 0)) break;
                                      }
                                    }
                                    dVar31 = fdata[lVar8 + sVar7];
                                    local_78 = dVar31;
                                    if (dVar33 <= dVar31) {
                                      local_78 = dVar33;
                                    }
                                    local_68 = dVar31;
                                    if (dVar31 <= dVar36) {
                                      local_68 = dVar36;
                                    }
                                    if (sVar9 == __nmemb_01) {
                                      lVar22 = lVar22 + 6;
                                    }
                                    else {
                                      sVar10 = sVar9 + 1;
                                      sVar7 = sVar10;
                                      if ((nullcheck != 0) && ((long)sVar10 < (long)__nmemb_01)) {
                                        while (sVar7 = sVar10, pdVar12[sVar10] == in_null_value) {
                                          if ((NAN(pdVar12[sVar10]) || NAN(in_null_value)) ||
                                             (sVar10 = sVar10 + 1, sVar7 = __nmemb_01,
                                             __nmemb_01 - sVar10 == 0)) break;
                                        }
                                      }
                                      dVar33 = fdata[lVar8 + sVar9];
                                      dVar36 = dVar33;
                                      if (local_78 <= dVar33) {
                                        dVar36 = local_78;
                                      }
                                      dVar37 = dVar33;
                                      if (dVar33 <= local_68) {
                                        dVar37 = local_68;
                                      }
                                      if (sVar7 == __nmemb_01) {
                                        lVar22 = lVar22 + 7;
                                        local_68 = dVar37;
                                        local_78 = dVar36;
                                      }
                                      else {
                                        dVar35 = fdata[lVar8 + sVar7];
                                        lVar22 = lVar22 + 8;
                                        local_78 = dVar35;
                                        if (dVar36 <= dVar35) {
                                          local_78 = dVar36;
                                        }
                                        local_68 = dVar35;
                                        if (dVar35 <= dVar37) {
                                          local_68 = dVar37;
                                        }
                                        sVar7 = sVar7 + 1;
                                        if ((long)sVar7 < (long)__nmemb_01) {
                                          local_c8 = 0.0;
                                          lVar3 = 0;
                                          uVar25 = SUB84(dVar1,0);
                                          uVar27 = (int)((ulong)dVar1 >> 0x20);
                                          uVar29 = SUB84(dVar28,0);
                                          uVar30 = (int)((ulong)dVar28 >> 0x20);
                                          do {
                                            dVar28 = dVar34;
                                            dVar34 = (double)CONCAT44(uVar27,uVar25);
                                            sVar10 = sVar7;
                                            if ((nullcheck != 0) && ((long)sVar7 < (long)__nmemb_01)
                                               ) {
                                              while (sVar10 = sVar7, pdVar12[sVar7] == in_null_value
                                                    ) {
                                                if ((NAN(pdVar12[sVar7]) || NAN(in_null_value)) ||
                                                   (sVar7 = sVar7 + 1, sVar10 = __nmemb_01,
                                                   __nmemb_01 - sVar7 == 0)) break;
                                              }
                                            }
                                            if (sVar10 == __nmemb_01) break;
                                            if ((double)CONCAT44(uVar30,uVar29) == dVar31) {
                                              if ((dVar31 != dVar33) || (NAN(dVar31) || NAN(dVar33))
                                                 ) goto LAB_001f7fae;
                                            }
                                            else {
LAB_001f7fae:
                                              pdVar4[lVar3] =
                                                   ABS((double)CONCAT44(uVar30,uVar29) - dVar33);
                                              lVar3 = lVar3 + 1;
                                            }
                                            dVar1 = fdata[lVar8 + sVar10];
                                            if ((((((double)CONCAT44(uVar30,uVar29) != dVar31) ||
                                                  (NAN((double)CONCAT44(uVar30,uVar29)) ||
                                                   NAN(dVar31))) || (dVar28 != dVar34)) ||
                                                ((dVar34 != (double)CONCAT44(uVar30,uVar29) ||
                                                 (NAN(dVar34) ||
                                                  NAN((double)CONCAT44(uVar30,uVar29)))))) ||
                                               ((dVar31 != dVar33 || (NAN(dVar31) || NAN(dVar33)))))
                                            {
                                              arr[(long)local_c8] =
                                                   ABS((((double)CONCAT44(uVar30,uVar29) +
                                                        (double)CONCAT44(uVar30,uVar29)) - dVar28) -
                                                       dVar33);
                                              local_d0[(long)local_c8] =
                                                   ABS((double)CONCAT44(uVar26,uVar24) +
                                                       dVar33 * -4.0 +
                                                       (double)CONCAT44(uVar30,uVar29) * 6.0 +
                                                       dVar28 * -4.0 + dVar1);
                                              local_c8 = (double)((long)local_c8 + 1);
                                            }
                                            else {
                                              lVar22 = lVar22 + 1;
                                            }
                                            dVar36 = dVar1;
                                            if (local_78 <= dVar1) {
                                              dVar36 = local_78;
                                            }
                                            local_78 = dVar36;
                                            dVar36 = dVar1;
                                            if (dVar1 <= local_68) {
                                              dVar36 = local_68;
                                            }
                                            local_68 = dVar36;
                                            sVar7 = sVar10 + 1;
                                            uVar24 = SUB84(dVar32,0);
                                            uVar26 = (undefined4)((ulong)dVar32 >> 0x20);
                                            uVar25 = uVar29;
                                            uVar27 = uVar30;
                                            uVar29 = SUB84(dVar31,0);
                                            uVar30 = (int)((ulong)dVar31 >> 0x20);
                                            dVar31 = dVar33;
                                            dVar33 = dVar35;
                                            dVar35 = dVar1;
                                            dVar32 = dVar28;
                                          } while ((long)sVar7 < (long)__nmemb_01);
                                        }
                                        else {
                                          lVar3 = 0;
                                          local_c8 = 0.0;
                                        }
                                        lVar22 = lVar22 + (long)local_c8;
                                        if (local_c8 != 0.0) {
                                          if (local_c8 == 4.94065645841247e-324) {
                                            if (lVar3 == 1) {
                                              __base[local_80] = *pdVar4;
                                              local_80 = local_80 + 1;
                                            }
                                            __base_00[__nmemb_00] = *arr;
                                            uVar24 = SUB84(*local_d0,0);
                                            uVar26 = (undefined4)((ulong)*local_d0 >> 0x20);
                                          }
                                          else {
                                            iVar14 = SUB84(local_c8,0);
                                            if (1 < lVar3) {
                                              dVar34 = quick_select_double(pdVar4,iVar14);
                                              __base[local_80] = dVar34;
                                              local_80 = local_80 + 1;
                                            }
                                            dVar34 = quick_select_double(arr,iVar14);
                                            __base_00[__nmemb_00] = dVar34;
                                            dVar34 = quick_select_double(local_d0,iVar14);
                                            uVar24 = SUB84(dVar34,0);
                                            uVar26 = (undefined4)((ulong)dVar34 >> 0x20);
                                          }
                                          pdVar5[__nmemb_00] = (double)CONCAT44(uVar26,uVar24);
                                          __nmemb_00 = __nmemb_00 + 1;
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                        sVar20 = sVar20 + 1;
                        pdVar12 = pdVar12 + lVar13 * nxpix;
                      } while (sVar20 != __nmemb);
                    }
                    local_a8 = 0.0;
                    local_98 = 0.0;
                    if (__nmemb_00 != 0) {
                      if (__nmemb_00 == 1) {
                        local_a8 = *__base_00;
                        local_98 = *pdVar5;
                      }
                      else {
                        qsort(__base_00,__nmemb_00,8,FnCompare_double);
                        qsort(pdVar5,__nmemb_00,8,FnCompare_double);
                        lVar13 = ((__nmemb_00 - ((long)(__nmemb_00 - 1) >> 0x3f)) - 1 &
                                 0x3ffffffffffffffe) * 4;
                        lVar8 = (__nmemb_00 - ((long)__nmemb_00 >> 0x3f) & 0x3ffffffffffffffe) * 4;
                        local_a8 = (*(double *)((long)__base_00 + lVar13) +
                                   *(double *)((long)__base_00 + lVar8)) * 0.5;
                        local_98 = (*(double *)((long)pdVar5 + lVar13) +
                                   *(double *)((long)pdVar5 + lVar8)) * 0.5;
                      }
                    }
                    local_c8 = 0.0;
                    if (local_80 != 0) {
                      if (local_80 == 1) {
                        local_c8 = *__base;
                      }
                      else {
                        qsort(__base,local_80,8,FnCompare_double);
                        local_c8 = (*(double *)
                                     ((long)__base +
                                     ((local_80 - ((long)(local_80 - 1) >> 0x3f)) - 1 &
                                     0xfffffffffffffffe) * 4) +
                                   *(double *)
                                    ((long)__base +
                                    (local_80 - ((long)local_80 >> 0x3f) & 0xfffffffffffffffe) * 4))
                                   * 0.5;
                      }
                    }
                    local_c8 = local_c8 * 1.0483579;
                    local_a8 = local_a8 * 0.6052697;
                    local_98 = local_98 * 0.1772048;
                    free(pdVar5);
                    pdVar5 = pdVar4;
                    pdVar4 = __base_00;
                    arr = __base;
                  }
                  free(pdVar4);
                  pdVar4 = arr;
                  arr = local_d0;
                  local_d0 = pdVar5;
                }
                free(pdVar4);
                pdVar4 = arr;
              }
              free(pdVar4);
              arr = local_d0;
              pdVar4 = local_f0;
            }
            free(pdVar4);
            pdVar4 = arr;
          }
          free(pdVar4);
        }
      }
      if ((nullcheck == 0) || (lVar22 != 0)) {
        if (local_c8 == 0.0 || local_a8 <= local_c8) {
          local_c8 = local_a8;
        }
        if (((local_98 == 0.0) && (!NAN(local_98))) || (local_c8 <= local_98)) {
          local_98 = local_c8;
        }
      }
      else {
        local_68 = 1.0;
        local_78 = 0.0;
        local_98 = 1.0;
      }
      dVar34 = local_98 / (double)qlevel;
      if ((qlevel == 0.0) && (!NAN(qlevel))) {
        dVar34 = local_98 * 0.25;
      }
      if ((dVar34 != 0.0) || (NAN(dVar34))) goto LAB_001f868b;
    }
    else {
      lVar8 = 1;
      lVar13 = nypix;
      if (nxpix < 5) {
        lVar13 = 1;
        lVar8 = nypix;
      }
      dVar34 = (double)-qlevel;
      lVar3 = lVar8 * nxpix;
      if (lVar3 < 5) {
        if (lVar3 < 1) {
LAB_001f8215:
          local_68 = -1.79769313486232e+308;
          local_78 = 1.79769313486232e+308;
          lVar22 = 0;
        }
        else {
          local_78 = 1.79769313486232e+308;
          local_68 = -1.79769313486232e+308;
          lVar22 = 0;
          lVar13 = 0;
          do {
            if (nullcheck == 0) {
LAB_001f78ff:
              dVar28 = fdata[lVar13];
              uVar24 = SUB84(dVar28,0);
              uVar26 = (undefined4)((ulong)dVar28 >> 0x20);
              dVar32 = dVar28;
              if (local_78 <= dVar28) {
                dVar32 = local_78;
              }
              local_78 = dVar32;
              if (dVar28 <= local_68) {
                uVar24 = SUB84(local_68,0);
                uVar26 = (undefined4)((ulong)local_68 >> 0x20);
              }
              lVar22 = lVar22 + 1;
              local_68 = (double)CONCAT44(uVar26,uVar24);
            }
            else if ((fdata[lVar13] != in_null_value) || (NAN(fdata[lVar13]) || NAN(in_null_value)))
            goto LAB_001f78ff;
            lVar13 = lVar13 + 1;
          } while (lVar3 - lVar13 != 0);
        }
      }
      else {
        if (lVar13 < 1) goto LAB_001f8215;
        local_78 = 1.79769313486232e+308;
        local_68 = -1.79769313486232e+308;
        lVar22 = 0;
        lVar15 = 0;
        pdVar4 = fdata;
        do {
          lVar17 = 0;
          lVar18 = lVar17;
          if (nullcheck != 0) {
            do {
              lVar18 = lVar17;
              if ((pdVar4[lVar17] != in_null_value) || (NAN(pdVar4[lVar17]) || NAN(in_null_value)))
              break;
              lVar17 = lVar17 + 1;
              lVar18 = lVar3;
            } while (lVar3 - lVar17 != 0);
          }
          if (lVar18 != lVar3) {
            lVar17 = lVar18 + 1;
            lVar16 = lVar17;
            if ((nullcheck != 0) && (lVar17 < lVar3)) {
              while (lVar16 = lVar17, pdVar4[lVar17] == in_null_value) {
                if ((NAN(pdVar4[lVar17]) || NAN(in_null_value)) ||
                   (lVar17 = lVar17 + 1, lVar16 = lVar3, lVar3 - lVar17 == 0)) break;
              }
            }
            lVar17 = lVar15 * lVar3;
            dVar28 = fdata[lVar17 + lVar18];
            uVar24 = SUB84(dVar28,0);
            uVar26 = (undefined4)((ulong)dVar28 >> 0x20);
            dVar32 = dVar28;
            if (local_78 <= dVar28) {
              dVar32 = local_78;
            }
            local_78 = dVar32;
            if (dVar28 <= local_68) {
              uVar24 = SUB84(local_68,0);
              uVar26 = (undefined4)((ulong)local_68 >> 0x20);
            }
            if (lVar16 == lVar3) {
              local_68 = (double)CONCAT44(uVar26,uVar24);
            }
            else {
              lVar18 = lVar16 + 1;
              lVar19 = lVar18;
              if ((nullcheck != 0) && (lVar18 < lVar3)) {
                while (lVar19 = lVar18, pdVar4[lVar18] == in_null_value) {
                  if ((NAN(pdVar4[lVar18]) || NAN(in_null_value)) ||
                     (lVar18 = lVar18 + 1, lVar19 = lVar3, lVar3 - lVar18 == 0)) break;
                }
              }
              local_68 = fdata[lVar17 + lVar16];
              dVar28 = local_68;
              if (local_78 <= local_68) {
                dVar28 = local_78;
              }
              local_78 = dVar28;
              if (local_68 <= (double)CONCAT44(uVar26,uVar24)) {
                local_68 = (double)CONCAT44(uVar26,uVar24);
              }
              if (lVar19 != lVar3) {
                lVar18 = lVar19 + 1;
                lVar16 = lVar18;
                if ((nullcheck != 0) && (lVar18 < lVar3)) {
                  while (lVar16 = lVar18, pdVar4[lVar18] == in_null_value) {
                    if ((NAN(pdVar4[lVar18]) || NAN(in_null_value)) ||
                       (lVar18 = lVar18 + 1, lVar16 = lVar3, lVar3 - lVar18 == 0)) break;
                  }
                }
                dVar28 = fdata[lVar17 + lVar19];
                uVar24 = SUB84(dVar28,0);
                uVar26 = (undefined4)((ulong)dVar28 >> 0x20);
                if (local_78 <= dVar28) {
                  uVar24 = SUB84(local_78,0);
                  uVar26 = (undefined4)((ulong)local_78 >> 0x20);
                }
                if (dVar28 <= local_68) {
                  dVar28 = local_68;
                }
                local_68 = dVar28;
                if (lVar16 == lVar3) {
                  local_78 = (double)CONCAT44(uVar26,uVar24);
                }
                else {
                  dVar28 = fdata[lVar17 + lVar16];
                  uVar25 = SUB84(dVar28,0);
                  uVar27 = (undefined4)((ulong)dVar28 >> 0x20);
                  local_78 = dVar28;
                  if ((double)CONCAT44(uVar26,uVar24) <= dVar28) {
                    local_78 = (double)CONCAT44(uVar26,uVar24);
                  }
                  if (dVar28 <= local_68) {
                    uVar25 = SUB84(local_68,0);
                    uVar27 = (undefined4)((ulong)local_68 >> 0x20);
                  }
                  lVar16 = lVar16 + 1;
                  dVar28 = local_78;
                  if (lVar16 < lVar3) {
                    do {
                      lVar18 = lVar16;
                      if ((nullcheck != 0) && (lVar16 < lVar3)) {
                        while (lVar18 = lVar16, pdVar4[lVar16] == in_null_value) {
                          if ((NAN(pdVar4[lVar16]) || NAN(in_null_value)) ||
                             (lVar16 = lVar16 + 1, lVar18 = lVar3, lVar3 - lVar16 == 0)) break;
                        }
                      }
                      local_78 = dVar28;
                      if (lVar18 == lVar3) goto LAB_001f7b5a;
                      local_68 = fdata[lVar17 + lVar18];
                      local_78 = local_68;
                      if (dVar28 <= local_68) {
                        local_78 = dVar28;
                      }
                      if (local_68 <= (double)CONCAT44(uVar27,uVar25)) {
                        local_68 = (double)CONCAT44(uVar27,uVar25);
                      }
                      lVar22 = lVar22 + 1;
                      lVar16 = lVar18 + 1;
                      uVar25 = SUB84(local_68,0);
                      uVar27 = (undefined4)((ulong)local_68 >> 0x20);
                      dVar28 = local_78;
                    } while (lVar16 < lVar3);
                  }
                  else {
LAB_001f7b5a:
                    local_68 = (double)CONCAT44(uVar27,uVar25);
                  }
                  lVar22 = lVar22 + 4;
                }
              }
            }
          }
          lVar15 = lVar15 + 1;
          pdVar4 = pdVar4 + lVar8 * nxpix;
        } while (lVar15 != lVar13);
      }
LAB_001f868b:
      dVar28 = (local_68 - local_78) / dVar34;
      if (dVar28 <= 4294967284.0) {
        if (row < 1) {
          uVar23 = 0;
          iVar14 = 0;
        }
        else {
          if ((fits_rand_value == (float *)0x0) && (iVar14 = fits_init_randoms(), iVar14 != 0)) {
            return 0x71;
          }
          uVar23 = (ulong)(uint)((int)(row - 1U) + (int)((row - 1U) / 10000) * -10000);
          iVar14 = (int)(fits_rand_value[uVar23] * 500.0);
        }
        pfVar2 = fits_rand_value;
        if (lVar22 == lVar21) {
          if (dither_method == 2) {
            dVar28 = dVar34 * 2147483637.0 + local_78;
          }
          else if (2147483637.0 <= dVar28) {
            dVar28 = (local_78 + local_68) * 0.5;
          }
          else {
            dVar28 = (double)(long)(local_78 / dVar34 + 0.5) * dVar34;
          }
          if (row < 1) {
            lVar13 = 1;
            if (1 < lVar21) {
              lVar13 = lVar21;
            }
            lVar21 = 0;
            do {
              dVar32 = (fdata[lVar21] - dVar28) / dVar34;
              idata[lVar21] = (int)(dVar32 + *(double *)(&DAT_0021cc50 + (ulong)(dVar32 < 0.0) * 8))
              ;
              lVar21 = lVar21 + 1;
            } while (lVar13 != lVar21);
          }
          else {
            lVar13 = 1;
            if (1 < lVar21) {
              lVar13 = lVar21;
            }
            lVar21 = 0;
            do {
              if (dither_method == 2) {
                iVar11 = -0x7ffffffe;
                if ((fdata[lVar21] != 0.0) || (NAN(fdata[lVar21]))) goto LAB_001f8980;
              }
              else {
LAB_001f8980:
                dVar32 = (double)pfVar2[iVar14] + (fdata[lVar21] - dVar28) / dVar34 + -0.5;
                iVar11 = (int)(dVar32 + *(double *)(&DAT_0021cc50 + (ulong)(dVar32 < 0.0) * 8));
              }
              idata[lVar21] = iVar11;
              iVar14 = iVar14 + 1;
              if (iVar14 == 10000) {
                uVar6 = (int)uVar23 + 1;
                uVar23 = (ulong)uVar6;
                if (uVar6 == 10000) {
                  uVar23 = 0;
                }
                iVar14 = (int)(pfVar2[(int)uVar23] * 500.0);
              }
              lVar21 = lVar21 + 1;
            } while (lVar13 != lVar21);
          }
        }
        else {
          dVar28 = dVar34 * 2147483637.0 + local_78;
          if (row < 1) {
            lVar13 = 1;
            if (1 < lVar21) {
              lVar13 = lVar21;
            }
            lVar21 = 0;
            do {
              dVar32 = fdata[lVar21];
              if ((dVar32 != in_null_value) || (NAN(dVar32) || NAN(in_null_value))) {
                dVar32 = (dVar32 - dVar28) / dVar34;
                iVar14 = (int)(dVar32 + *(double *)(&DAT_0021cc50 + (ulong)(dVar32 < 0.0) * 8));
              }
              else {
                iVar14 = -0x7fffffff;
              }
              idata[lVar21] = iVar14;
              lVar21 = lVar21 + 1;
            } while (lVar13 != lVar21);
          }
          else {
            lVar13 = 1;
            if (1 < lVar21) {
              lVar13 = lVar21;
            }
            lVar21 = 0;
            do {
              dVar32 = fdata[lVar21];
              if ((dVar32 != in_null_value) || (NAN(dVar32) || NAN(in_null_value))) {
                if (dither_method == 2) {
                  iVar11 = -0x7ffffffe;
                  if ((dVar32 == 0.0) && (!NAN(dVar32))) goto LAB_001f87de;
                }
                dVar32 = (double)pfVar2[iVar14] + (dVar32 - dVar28) / dVar34 + -0.5;
                iVar11 = (int)(dVar32 + *(double *)(&DAT_0021cc50 + (ulong)(dVar32 < 0.0) * 8));
              }
              else {
                iVar11 = -0x7fffffff;
              }
LAB_001f87de:
              idata[lVar21] = iVar11;
              iVar14 = iVar14 + 1;
              if (iVar14 == 10000) {
                uVar6 = (int)uVar23 + 1;
                uVar23 = (ulong)uVar6;
                if (uVar6 == 10000) {
                  uVar23 = 0;
                }
                iVar14 = (int)(pfVar2[(int)uVar23] * 500.0);
              }
              lVar21 = lVar21 + 1;
            } while (lVar13 != lVar21);
          }
        }
        dVar32 = (local_78 - dVar28) / dVar34;
        uVar23 = -(ulong)(dVar32 < 0.0);
        *iminval = (int)((double)(~uVar23 & 0x3fe0000000000000 |
                                 (ulong)((uint)(uVar23 >> 0x20) & 0xbfe00000) << 0x20) + dVar32);
        dVar32 = (local_68 - dVar28) / dVar34;
        uVar23 = -(ulong)(dVar32 < 0.0);
        *imaxval = (int)((double)(~uVar23 & 0x3fe0000000000000 |
                                 (ulong)((uint)(uVar23 >> 0x20) & 0xbfe00000) << 0x20) + dVar32);
        iVar14 = 1;
        goto LAB_001f8aa6;
      }
    }
    iVar14 = 0;
  }
  return iVar14;
}

Assistant:

int fits_quantize_double (long row, double fdata[], long nxpix, long nypix, int nullcheck, 
	double in_null_value, float qlevel, int dither_method, int idata[], double *bscale,
	double *bzero, int *iminval, int *imaxval) {

/* arguments:
long row            i: tile number = row number in the binary table
                       (this is only used when dithering the quantized values)
double fdata[]      i: array of image pixels to be compressed
long nxpix          i: number of pixels in each row of fdata
long nypix          i: number of rows in fdata
nullcheck           i: check for nullvalues in fdata?
double in_null_value i: value used to represent undefined pixels in fdata
float qlevel        i: quantization level
int dither_method   i; which dithering method to use
int idata[]         o: values of fdata after applying bzero and bscale
double bscale       o: scale factor
double bzero        o: zero offset
int iminval         o: minimum quantized value that is returned
int imaxval         o: maximum quantized value that is returned

The function value will be one if the input fdata were copied to idata;
in this case the parameters bscale and bzero can be used to convert back to
nearly the original floating point values:  fdata ~= idata * bscale + bzero.
If the function value is zero, the data were not copied to idata.
*/

	int status, iseed = 0;
	long i, nx, ngood = 0;
	double stdev, noise2 = 0., noise3 = 0., noise5 = 0.;	/* MAD 2nd, 3rd, and 5th order noise values */
	double minval = 0., maxval = 0.;  /* min & max of fdata */
	double delta;		/* bscale, 1 in idata = delta in fdata */
	double zeropt;	        /* bzero */
	double temp;
        int nextrand = 0;
	extern float *fits_rand_value;
	LONGLONG iqfactor;

	nx = nxpix * nypix;
	if (nx <= 1) {
	    *bscale = 1.;
	    *bzero  = 0.;
	    return (0);
	}

        if (qlevel >= 0.) {

	    /* estimate background noise using MAD pixel differences */
	    FnNoise5_double(fdata, nxpix, nypix, nullcheck, in_null_value, &ngood,
	        &minval, &maxval, &noise2, &noise3, &noise5, &status);      

	    if (nullcheck && ngood == 0) {   /* special case of an image filled with Nulls */
	        /* set parameters to dummy values, which are not used */
		minval = 0.;
		maxval = 1.;
		stdev = 1;
	    } else {

	        /* use the minimum of noise2, noise3, and noise5 as the best noise value */
	        stdev = noise3;
	        if (noise2 != 0. && noise2 < stdev) stdev = noise2;
	        if (noise5 != 0. && noise5 < stdev) stdev = noise5;
            }

	    if (qlevel == 0.)
	        delta = stdev / 4.;  /* default quantization */
	    else
	        delta = stdev / qlevel;

	    if (delta == 0.) 
	        return (0);			/* don't quantize */

	} else {
	    /* negative value represents the absolute quantization level */
	    delta = -qlevel;

	    /* only nned to calculate the min and max values */
	    FnNoise3_double(fdata, nxpix, nypix, nullcheck, in_null_value, &ngood,
	        &minval, &maxval, 0, &status);      
 	}

        /* check that the range of quantized levels is not > range of int */
	if ((maxval - minval) / delta > 2. * 2147483647. - N_RESERVED_VALUES )
	    return (0);			/* don't quantize */

        if (row > 0) { /* we need to dither the quantized values */
            if (!fits_rand_value) 
	       if (fits_init_randoms()) return(MEMORY_ALLOCATION);

	    /* initialize the index to the next random number in the list */
            iseed = (int) ((row - 1) % N_RANDOM);
	    nextrand = (int) (fits_rand_value[iseed] * 500);
	}

        if (ngood == nx) {   /* don't have to check for nulls */
            /* return all positive values, if possible since some */
            /* compression algorithms either only work for positive integers, */
            /* or are more efficient.  */

            if (dither_method == SUBTRACTIVE_DITHER_2)
	    {
                /* shift the range to be close to the value used to represent zeros */
                zeropt = minval - delta * (NULL_VALUE + N_RESERVED_VALUES);
            }
	    else if ((maxval - minval) / delta < 2147483647. - N_RESERVED_VALUES )
            {
                zeropt = minval;
		/* fudge the zero point so it is an integer multiple of delta */
		/* This helps to ensure the same scaling will be performed if the */
		/* file undergoes multiple fpack/funpack cycles */
		iqfactor = (LONGLONG) (zeropt/delta  + 0.5);
		zeropt = iqfactor * delta;               
            }
            else
            {
                /* center the quantized levels around zero */
                zeropt = (minval + maxval) / 2.;
            }

            if (row > 0) {  /* dither the values when quantizing */
       	      for (i = 0;  i < nx;  i++) {

		if (dither_method == SUBTRACTIVE_DITHER_2 && fdata[i] == 0.0) {
		   idata[i] = ZERO_VALUE;
		} else {
		   idata[i] =  NINT((((double) fdata[i] - zeropt) / delta) + fits_rand_value[nextrand] - 0.5);
		}

                nextrand++;
		if (nextrand == N_RANDOM) {
                    iseed++;
		    if (iseed == N_RANDOM) iseed = 0;
	            nextrand = (int) (fits_rand_value[iseed] * 500);
                }
              }
            } else {  /* do not dither the values */

       	        for (i = 0;  i < nx;  i++) {
	            idata[i] = NINT ((fdata[i] - zeropt) / delta);
                }
            } 
        }
        else {
            /* data contains null values; shift the range to be */
            /* close to the value used to represent null values */
            zeropt = minval - delta * (NULL_VALUE + N_RESERVED_VALUES);

            if (row > 0) {  /* dither the values */
	      for (i = 0;  i < nx;  i++) {
                if (fdata[i] != in_null_value) {
		    if (dither_method == SUBTRACTIVE_DITHER_2 && fdata[i] == 0.0) {
		       idata[i] = ZERO_VALUE;
		    } else {
		       idata[i] =  NINT((((double) fdata[i] - zeropt) / delta) + fits_rand_value[nextrand] - 0.5);
		    }
                } else {
                    idata[i] = NULL_VALUE;
                }

                /* increment the random number index, regardless */
                nextrand++;
		if (nextrand == N_RANDOM) {
		    iseed++;
		    if (iseed == N_RANDOM) iseed = 0;
	            nextrand = (int) (fits_rand_value[iseed] * 500);
                }
              }
            } else {  /* do not dither the values */
	       for (i = 0;  i < nx;  i++) {
                 if (fdata[i] != in_null_value)
		    idata[i] =  NINT((fdata[i] - zeropt) / delta);
                 else 
                    idata[i] = NULL_VALUE;
               }
            }
	}

        /* calc min and max values */
        temp = (minval - zeropt) / delta;
        *iminval =  NINT (temp);
        temp = (maxval - zeropt) / delta;
        *imaxval =  NINT (temp);

	*bscale = delta;
	*bzero = zeropt;

	return (1);			/* yes, data have been quantized */
}